

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

void __thiscall wasm::Asyncify::run(Asyncify *this,Module *module)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer puVar3;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var4;
  pointer puVar5;
  Export *pEVar6;
  pointer puVar7;
  _Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_> _Var8;
  size_t sVar9;
  Name *__args;
  char *pcVar10;
  long *plVar11;
  undefined8 *puVar12;
  _Hash_node_base *p_Var13;
  _Hash_node_base *p_Var14;
  pointer pcVar15;
  iterator __position;
  _Rb_tree_header *p_Var16;
  pointer pbVar17;
  pointer pNVar18;
  _Base_ptr p_Var19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  Asyncify *pAVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  char cVar27;
  int iVar28;
  int *piVar29;
  long lVar30;
  Memory *pMVar31;
  _Rb_tree_node_base *p_Var32;
  long *plVar33;
  string_view *psVar34;
  mapped_type *pmVar35;
  Expression *pEVar36;
  mapped_type *pmVar37;
  mapped_type *pmVar38;
  _Base_ptr p_Var39;
  ostream *poVar40;
  _Base_ptr p_Var41;
  _Head_base<0UL,_wasm::Function_*,_false> item;
  Function *pFVar42;
  mapped_type *pmVar43;
  ulong uVar44;
  _Rb_tree_node_base *p_Var45;
  undefined1 reuse;
  _Rb_tree_node_base *__tmp;
  string *defaultValue;
  variant<wasm::Name,_wasm::HeapType> *pvVar46;
  _func_int **pp_Var47;
  pointer puVar48;
  pointer pNVar49;
  undefined1 auVar50 [8];
  _Any_data *p_Var51;
  _Link_type __x;
  pointer puVar52;
  int iVar53;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *logging;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  undefined8 *puVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  string_view sVar59;
  pair<std::_Rb_tree_iterator<wasm::Function_*>,_std::_Rb_tree_iterator<wasm::Function_*>_> pVar60;
  string_view s;
  string_view s_00;
  string_view s_01;
  Name name;
  Name name_00;
  undefined1 local_c48 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  renamings;
  Type type;
  long local_c08 [2];
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_bf8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bc8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b68;
  undefined1 local_b38 [8];
  Function *func_1;
  Split listedImports;
  Split local_af0;
  Split local_ad0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_ab0;
  bool local_a90;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a88;
  bool local_a68;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a60;
  bool local_a40;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a38;
  char local_a18;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a10;
  bool local_9f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9e8;
  bool local_9c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9c0;
  bool local_9a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_998;
  bool local_978;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_970;
  bool local_950;
  string local_948;
  string local_928;
  string local_908;
  undefined1 local_8e8 [8];
  string ignoreImports;
  string stateChangingImports;
  long local_898;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  long *local_788;
  undefined8 uStack_780;
  code *local_778;
  code *pcStack_770;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  _Base_ptr local_748;
  _Rb_tree_node_base *local_740;
  _Rb_tree_node_base *p_Stack_738;
  _Rb_tree_node_base *local_730;
  undefined1 local_728 [8];
  _Head_base<0UL,_wasm::Global_*,_false> *local_720;
  pointer local_718;
  __node_base local_710;
  pointer puStack_708;
  float local_700;
  pointer local_6f8;
  _Head_base<0UL,_wasm::Global_*,_false> _Stack_6f0;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> *local_6e8;
  pointer local_6e0;
  __node_base local_6d8;
  pointer puStack_6d0;
  float local_6c8;
  pointer local_6c0;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Stack_6b8;
  char local_6b0;
  undefined1 local_6a8 [8];
  string removeListInput;
  string onlyListInput;
  string prefix;
  undefined1 auStack_588 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  loggings;
  size_t local_568;
  __node_base_ptr p_Stack_560;
  pointer local_558;
  pointer ppvStack_550;
  Split local_548;
  Split local_528;
  undefined1 auStack_508 [8];
  FuncSet instrumentedFuncs;
  undefined1 auStack_418 [8];
  __single_object glob;
  undefined1 local_408 [16];
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_3f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  Split local_318;
  _Any_data *local_2f0;
  pointer pNStack_2e8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcsToDelete;
  _Head_base<0UL,_wasm::Function_*,_false> local_2c8;
  __node_base local_2c0;
  _Head_base<0UL,_wasm::Pass_*,_false> local_2b8;
  _Head_base<0UL,_wasm::Pass_*,_false> local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  int local_25c;
  undefined **local_258;
  size_type local_250;
  undefined1 auStack_248 [8];
  string secondaryMemorySizeString;
  undefined1 auStack_1f8 [8];
  bool local_1f0;
  undefined7 uStack_1ef;
  _Storage<std::basic_ostream<char,_std::char_traits<char>_>_*,_true> local_1e8;
  ulong uStack_1e0;
  float local_1d8;
  __buckets_ptr local_1d0;
  _Hash_node_base _Stack_1c8;
  __node_base local_1c0;
  size_type sStack_1b8;
  float local_1b0;
  size_t local_1a8;
  __node_base_ptr p_Stack_1a0;
  _Hash_node_base *local_198;
  size_type local_190;
  __node_base local_188;
  size_type sStack_180;
  float local_178;
  size_t local_170;
  _Hash_node_base _Stack_168;
  undefined2 local_160;
  undefined1 *local_158;
  void *local_140;
  long local_130;
  _Any_data local_108;
  code *local_f8;
  _Any_data *local_c0;
  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  local_b8;
  undefined1 auStack_88 [8];
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range4;
  bool allImportsCanChangeState;
  Asyncify *pAStack_40;
  char local_31;
  
  iVar53 = (((this->super_Pass).runner)->options).optimizeLevel;
  glob._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)auStack_418;
  auStack_418 = (undefined1  [8])local_408;
  pAStack_40 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_418,"asyncify-imports","");
  onlyListInput.field_2._8_8_ = &prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&onlyListInput.field_2 + 8),"");
  Pass::getArgumentOrDefault
            ((string *)auStack_508,&pAStack_40->super_Pass,(string *)auStack_418,
             (string *)((long)&onlyListInput.field_2 + 8));
  read_possible_response_file((string *)auStack_248,(string *)auStack_508);
  String::trim((string *)((long)&ignoreImports.field_2 + 8),(string *)auStack_248);
  if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  psVar1 = &instrumentedFuncs._M_h._M_bucket_count;
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if ((size_type *)onlyListInput.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)onlyListInput.field_2._8_8_,prefix._M_string_length + 1);
  }
  if (auStack_418 != (undefined1  [8])local_408) {
    operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
  }
  auStack_248 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_248,"asyncify-ignore-imports","");
  auStack_508 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_508,"");
  Pass::getArgumentOrDefault
            ((string *)local_8e8,&pAStack_40->super_Pass,(string *)auStack_248,(string *)auStack_508
            );
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  iVar28 = std::__cxx11::string::compare(ignoreImports.field_2._M_local_buf + 8);
  if (iVar28 == 0) {
    iVar28 = std::__cxx11::string::compare(local_8e8);
    __range4._5_1_ = iVar28 == 0;
  }
  else {
    __range4._5_1_ = false;
  }
  auStack_508 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_508,",","");
  auStack_248 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_248,auStack_508,
             (pointer)((long)instrumentedFuncs._M_h._M_buckets + (long)auStack_508));
  String::Split::Split
            ((Split *)&func_1,(string *)((long)&ignoreImports.field_2 + 8),(NewLineOr *)auStack_248)
  ;
  if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  auStack_248 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_248,"asyncify-ignore-indirect","");
  bVar24 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_248);
  if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_248 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_248,"asyncify-removelist","");
  auStack_508 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_508,"");
  Pass::getArgumentOrDefault
            ((string *)local_6a8,&pAStack_40->super_Pass,(string *)auStack_248,(string *)auStack_508
            );
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  if (removeListInput._M_dataplus._M_p == (pointer)0x0) {
    auStack_508 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_508,"asyncify-blacklist","");
    auStack_418 = (undefined1  [8])local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_418,"");
    Pass::getArgumentOrDefault
              ((string *)auStack_248,&pAStack_40->super_Pass,(string *)auStack_508,
               (string *)auStack_418);
    std::__cxx11::string::operator=((string *)local_6a8,(string *)auStack_248);
    if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
      operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
    }
    if (auStack_418 != (undefined1  [8])local_408) {
      operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
    }
    if (auStack_508 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
  }
  read_possible_response_file((string *)auStack_508,(string *)local_6a8);
  String::trim((string *)auStack_248,(string *)auStack_508);
  onlyListInput.field_2._8_8_ = &prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&onlyListInput.field_2 + 8),",","");
  auStack_418 = (undefined1  [8])local_408;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_418,onlyListInput.field_2._8_8_,
             prefix._M_dataplus._M_p + onlyListInput.field_2._8_8_);
  String::Split::Split(&local_548,(string *)auStack_248,(NewLineOr *)auStack_418);
  if (auStack_418 != (undefined1  [8])local_408) {
    operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
  }
  if ((size_type *)onlyListInput.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)onlyListInput.field_2._8_8_,prefix._M_string_length + 1);
  }
  if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  onlyListInput.field_2._8_8_ = &prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&onlyListInput.field_2 + 8),"asyncify-addlist","");
  renamings._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_c08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
  Pass::getArgumentOrDefault
            ((string *)auStack_418,&pAStack_40->super_Pass,
             (string *)((long)&onlyListInput.field_2 + 8),
             (string *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  read_possible_response_file((string *)auStack_508,(string *)auStack_418);
  String::trim((string *)auStack_248,(string *)auStack_508);
  auStack_88 = (undefined1  [8])&analysis_1.field_0x8;
  local_25c = iVar53;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_88,",","");
  local_768._0_8_ = (Module *)local_758;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_768,auStack_88,
             (undefined1 *)
             ((long)&((analysis_1.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)auStack_88));
  String::Split::Split(&local_528,(string *)auStack_248,(NewLineOr *)local_768);
  if ((Module *)local_768._0_8_ != (Module *)local_758) {
    operator_delete((void *)local_768._0_8_,(ulong)(local_758._0_8_ + 1));
  }
  psVar2 = &secondaryMemorySizeString._M_string_length;
  if (auStack_88 != (undefined1  [8])&analysis_1.field_0x8) {
    operator_delete((void *)auStack_88,analysis_1._8_8_ + 1);
  }
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_418 != (undefined1  [8])local_408) {
    operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
  }
  if ((long *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count != local_c08) {
    operator_delete((void *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_c08[0] + 1);
  }
  if ((size_type *)onlyListInput.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)onlyListInput.field_2._8_8_,prefix._M_string_length + 1);
  }
  auStack_248 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_248,"asyncify-onlylist","");
  auStack_508 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_508,"");
  Pass::getArgumentOrDefault
            ((string *)((long)&removeListInput.field_2 + 8),&pAStack_40->super_Pass,
             (string *)auStack_248,(string *)auStack_508);
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  if (onlyListInput._M_dataplus._M_p == (pointer)0x0) {
    auStack_508 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_508,"asyncify-whitelist","");
    auStack_418 = (undefined1  [8])local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_418,"");
    Pass::getArgumentOrDefault
              ((string *)auStack_248,&pAStack_40->super_Pass,(string *)auStack_508,
               (string *)auStack_418);
    std::__cxx11::string::operator=
              ((string *)(removeListInput.field_2._M_local_buf + 8),(string *)auStack_248);
    if (auStack_248 != (undefined1  [8])psVar2) {
      operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
    }
    if (auStack_418 != (undefined1  [8])local_408) {
      operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
    }
    if (auStack_508 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
  }
  read_possible_response_file((string *)auStack_508,(string *)((long)&removeListInput.field_2 + 8));
  String::trim((string *)auStack_248,(string *)auStack_508);
  onlyListInput.field_2._8_8_ = &prefix._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&onlyListInput.field_2 + 8),",","");
  auStack_418 = (undefined1  [8])local_408;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_418,onlyListInput.field_2._8_8_,
             prefix._M_dataplus._M_p + onlyListInput.field_2._8_8_);
  String::Split::Split(&local_318,(string *)auStack_248,(NewLineOr *)auStack_418);
  if (auStack_418 != (undefined1  [8])local_408) {
    operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
  }
  if ((size_type *)onlyListInput.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)onlyListInput.field_2._8_8_,prefix._M_string_length + 1);
  }
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  if (auStack_508 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
  }
  auStack_248 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_248,"asyncify-asserts","");
  __range4._7_1_ = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_248);
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_248 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_248,"asyncify-verbose","");
  bVar25 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_248);
  local_258 = (undefined **)CONCAT71(local_258._1_7_,bVar25);
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_248 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_248,"asyncify-relocatable","");
  __range4._6_1_ = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_248);
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_248 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_248,"asyncify-in-secondary-memory","");
  bVar25 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_248);
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  auStack_248 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_248,"asyncify-propagate-addlist","");
  bVar26 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_248);
  local_250 = CONCAT71(local_250._1_7_,bVar26);
  if (auStack_248 != (undefined1  [8])psVar2) {
    operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
  }
  analysis_1._48_8_ = module;
  if (bVar25) {
    auStack_508 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_508,"asyncify-secondary-memory-size","");
    auStack_418 = (undefined1  [8])local_408;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_418,"1","");
    Pass::getArgumentOrDefault
              ((string *)auStack_248,&pAStack_40->super_Pass,(string *)auStack_508,
               (string *)auStack_418);
    if (auStack_418 != (undefined1  [8])local_408) {
      operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
    }
    if (auStack_508 != (undefined1  [8])psVar1) {
      operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
    }
    auVar50 = auStack_248;
    piVar29 = __errno_location();
    iVar53 = *piVar29;
    *piVar29 = 0;
    lVar30 = strtol((char *)auVar50,(char **)auStack_508,10);
    pAVar23 = pAStack_40;
    module = (Module *)analysis_1._48_8_;
    if (auStack_508 == auVar50) {
      std::__throw_invalid_argument("stoi");
LAB_007cf709:
      std::__throw_out_of_range("stoi");
    }
    if (((int)lVar30 != lVar30) || (*piVar29 == 0x22)) goto LAB_007cf709;
    if (*piVar29 == 0) {
      *piVar29 = iVar53;
    }
    sVar59 = (string_view)
             createSecondaryMemory
                       (pAStack_40,(Module *)analysis_1._48_8_,(Address)(long)(int)lVar30);
    (pAVar23->asyncifyMemory).super_IString.str = sVar59;
    if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
      operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
    }
  }
  else {
    puVar3 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar44 = (long)(module->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (uVar44 < 9) {
      if (puVar3 == (module->memories).
                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        sVar59 = IString::interned((IString *)0x1,(string_view)ZEXT816(0xe17284),SUB81(uVar44,0));
        auStack_248 = (undefined1  [8])operator_new(0x58);
        *(undefined8 *)&((Function *)auStack_248)->profile = 0;
        (((Function *)auStack_248)->vars).
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (((Function *)auStack_248)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        (((Function *)auStack_248)->type).id = 0;
        (((Function *)auStack_248)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        (((Function *)auStack_248)->super_Importable).base.super_IString.str._M_len = 0;
        *(undefined8 *)&(((Function *)auStack_248)->super_Importable).super_Named.hasExplicitName =
             0;
        (((Function *)auStack_248)->super_Importable).module.super_IString.str._M_len = 0;
        (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
        (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_str =
             (char *)0x0;
        *(undefined8 *)&((Function *)auStack_248)->profile = 0x10000;
        *(undefined1 *)
         &(((Function *)auStack_248)->vars).
          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
        (((Function *)auStack_248)->vars).
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x2;
        (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str = sVar59;
        *(undefined1 *)
         &(((Function *)auStack_248)->vars).
          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
        (((Function *)auStack_248)->vars).
        super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x2;
        *(undefined8 *)&((Function *)auStack_248)->profile = 1;
        (((Function *)auStack_248)->type).id = 1;
        Module::addMemory(module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                                 auStack_248);
        if (auStack_248 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_248,0x58);
        }
      }
      _Var4._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
      pcVar10 = *(char **)((long)_Var4._M_t.
                                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                 .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      (pAStack_40->asyncifyMemory).super_IString.str._M_len =
           *(size_t *)
            _Var4._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      (pAStack_40->asyncifyMemory).super_IString.str._M_str = pcVar10;
    }
    else {
      auStack_248 = (undefined1  [8])psVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_248,"asyncify-memory","");
      auStack_418 = (undefined1  [8])local_408;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_418,"memory","");
      defaultValue = (string *)auStack_418;
      Pass::getArgumentOrDefault
                ((string *)auStack_508,&pAStack_40->super_Pass,(string *)auStack_248,defaultValue);
      if (auStack_418 != (undefined1  [8])local_408) {
        operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
      }
      if (auStack_248 != (undefined1  [8])psVar2) {
        operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
      }
      puVar5 = (module->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar48 = (module->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar48 != puVar5;
          puVar48 = puVar48 + 1) {
        pEVar6 = (puVar48->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if ((pEVar6->kind == Memory) &&
           (sVar59._M_str = (char *)0x0, sVar59._M_len = (size_t)auStack_508,
           sVar59 = IString::interned((IString *)instrumentedFuncs._M_h._M_buckets,sVar59,
                                      SUB81(defaultValue,0)),
           (pEVar6->name).super_IString.str._M_str == sVar59._M_str)) {
          pEVar6 = (puVar48->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pvVar46 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
          if ((pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_index == '\0') {
            pvVar46 = &pEVar6->value;
          }
          pcVar10 = (pvVar46->super__Variant_base<wasm::Name,_wasm::HeapType>).
                    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first.
                    _M_storage.super_IString.str._M_str;
          (pAStack_40->asyncifyMemory).super_IString.str._M_len =
               *(size_t *)
                &(pvVar46->super__Variant_base<wasm::Name,_wasm::HeapType>).
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
          (pAStack_40->asyncifyMemory).super_IString.str._M_str = pcVar10;
          break;
        }
      }
      if ((pAStack_40->asyncifyMemory).super_IString.str._M_str == (char *)0x0) {
        Fatal::Fatal((Fatal *)auStack_248);
        Fatal::operator<<((Fatal *)auStack_248,
                          (char (*) [93])
                          "Please specify which of the multiple memories to use, with --pass-arg=asyncify-memory@memory"
                         );
        goto LAB_007cfa56;
      }
      module = (Module *)analysis_1._48_8_;
      if (auStack_508 != (undefined1  [8])psVar1) {
        operator_delete((void *)auStack_508,instrumentedFuncs._M_h._M_bucket_count + 1);
        module = (Module *)analysis_1._48_8_;
      }
    }
  }
  pAVar23 = pAStack_40;
  pMVar31 = Module::getMemory(module,(Name)(pAStack_40->asyncifyMemory).super_IString.str);
  (pAVar23->pointerType).id = (ulong)((pMVar31->addressType).id == 3) | 2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&listedImports.needToHandleBracketingOperations,
           &local_548.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  String::handleBracketingOperators
            ((Split *)auStack_248,(Split *)&listedImports.needToHandleBracketingOperations);
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)
       local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  instrumentedFuncs._M_h._M_buckets =
       (__buckets_ptr)
       local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_508 = (undefined1  [8])
                local_548.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_548.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_248;
  local_548.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)secondaryMemorySizeString._M_dataplus._M_p;
  local_548.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)secondaryMemorySizeString._M_string_length;
  auStack_248 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  secondaryMemorySizeString._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_508);
  local_548.needToHandleBracketingOperations =
       (bool)secondaryMemorySizeString.field_2._M_local_buf[0];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&listedImports.needToHandleBracketingOperations);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_af0.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&local_528.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_af0.needToHandleBracketingOperations = local_528.needToHandleBracketingOperations;
  String::handleBracketingOperators((Split *)auStack_248,&local_af0);
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)
       local_528.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  instrumentedFuncs._M_h._M_buckets =
       (__buckets_ptr)
       local_528.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_508 = (undefined1  [8])
                local_528.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_528.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_248;
  local_528.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)secondaryMemorySizeString._M_dataplus._M_p;
  local_528.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)secondaryMemorySizeString._M_string_length;
  auStack_248 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  secondaryMemorySizeString._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_508);
  local_528.needToHandleBracketingOperations =
       (bool)secondaryMemorySizeString.field_2._M_local_buf[0];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_af0.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_ad0.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&local_318.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_ad0.needToHandleBracketingOperations = local_318.needToHandleBracketingOperations;
  String::handleBracketingOperators((Split *)auStack_248,&local_ad0);
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)
       local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  instrumentedFuncs._M_h._M_buckets =
       (__buckets_ptr)
       local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_508 = (undefined1  [8])
                local_318.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_318.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_248;
  local_318.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)secondaryMemorySizeString._M_dataplus._M_p;
  local_318.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)secondaryMemorySizeString._M_string_length;
  auStack_248 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  secondaryMemorySizeString._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_508);
  local_318.needToHandleBracketingOperations =
       (bool)secondaryMemorySizeString.field_2._M_local_buf[0];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_ad0.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if ((local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_318.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_548.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      (local_528.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_528.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    Fatal::Fatal((Fatal *)auStack_248);
    Fatal::operator<<((Fatal *)auStack_248,
                      (char (*) [80])
                      "It makes no sense to use both an asyncify only-list together with another list."
                     );
LAB_007cfa56:
    Fatal::~Fatal((Fatal *)auStack_248);
  }
  local_768[8] = !bVar24;
  local_568 = (long)&__range4 + 5;
  p_Stack_560 = (__node_base_ptr)&func_1;
  ppvStack_550 = (pointer)std::
                          _Function_handler<bool_(wasm::Name,_wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:1693:33)>
                          ::_M_invoke;
  local_558 = (pointer)std::
                       _Function_handler<bool_(wasm::Name,_wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:1693:33)>
                       ::_M_manager;
  local_31 = (char)local_258;
  local_740 = (_Rb_tree_node_base *)(local_758 + 8);
  local_758._8_4_ = 0;
  local_748 = (_Base_ptr)0x0;
  local_730 = (_Rb_tree_node_base *)0x0;
  local_720 = &_Stack_6f0;
  local_718 = (pointer)0x1;
  local_710._M_nxt = (_Hash_node_base *)0x0;
  puStack_708 = (pointer)0x0;
  local_700 = 1.0;
  local_6f8 = (pointer)0x0;
  _Stack_6f0._M_head_impl = (Global *)0x0;
  local_6e8 = &_Stack_6b8;
  local_6e0 = (pointer)0x1;
  local_6d8._M_nxt = (_Hash_node_base *)0x0;
  puStack_6d0 = (pointer)0x0;
  local_6c8 = 1.0;
  local_6c0 = (pointer)0x0;
  _Stack_6b8._M_head_impl = (ElementSegment *)0x0;
  onlyListInput.field_2._8_8_ = &prefix._M_string_length;
  auStack_248 = (undefined1  [8])0x1a;
  local_768._0_8_ = module;
  p_Stack_738 = local_740;
  local_728 = (undefined1  [8])module;
  __range4._4_1_ = local_768[8];
  onlyListInput.field_2._8_8_ =
       std::__cxx11::string::_M_create
                 ((ulong *)(onlyListInput.field_2._M_local_buf + 8),(ulong)auStack_248);
  prefix._M_string_length = (size_type)auStack_248;
  builtin_strncpy((char *)onlyListInput.field_2._8_8_,"asyncify_fake_call_global_",0x1a);
  prefix._M_dataplus._M_p = (pointer)auStack_248;
  *(char *)(onlyListInput.field_2._8_8_ + (long)auStack_248) = '\0';
  _auStack_418 = (_Any_data)ZEXT816(0);
  local_408._8_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:414:15)>
       ::_M_invoke;
  local_408._0_8_ =
       std::
       _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:414:15)>
       ::_M_manager;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)auStack_248,(Module *)local_728,(Func *)auStack_418);
  if ((code *)local_408._0_8_ != (code *)0x0) {
    (*(code *)local_408._0_8_)(auStack_418,auStack_418,3);
  }
  auStack_508 = (undefined1  [8])&instrumentedFuncs._M_h._M_rehash_policy._M_next_resize;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  instrumentedFuncs._M_h._M_bucket_count = 0;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  instrumentedFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._1_7_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._3_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  p_Var32 = (_Rb_tree_node_base *)
            CONCAT71(secondaryMemorySizeString.field_2._9_7_,
                     secondaryMemorySizeString.field_2._M_local_buf[8]);
  if (p_Var32 != (_Rb_tree_node_base *)&secondaryMemorySizeString._M_string_length) {
    do {
      for (p_Var41 = p_Var32[1]._M_right; p_Var41 != (_Base_ptr)0x0; p_Var41 = *(_Base_ptr *)p_Var41
          ) {
        auStack_88 = (undefined1  [8])p_Var41->_M_parent;
        renamings._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)auStack_508;
        std::
        _Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Type_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Type,true>>>>
                  ((_Hashtable<wasm::Type,wasm::Type,std::allocator<wasm::Type>,std::__detail::_Identity,std::equal_to<wasm::Type>,std::hash<wasm::Type>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)auStack_508,auStack_88,
                   &renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      p_Var32 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var32);
    } while (p_Var32 != (_Rb_tree_node_base *)&secondaryMemorySizeString._M_string_length);
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
               *)&secondaryMemorySizeString);
  p_Var51 = (_Any_data *)analysis_1._48_8_;
  for (puVar54 = (undefined8 *)instrumentedFuncs._M_h._M_bucket_count; puVar54 != (undefined8 *)0x0;
      puVar54 = (undefined8 *)*puVar54) {
    renamings._M_t._M_impl.super__Rb_tree_header._M_node_count = puVar54[1];
    auStack_88 = (undefined1  [8])renamings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    wasm::Type::toString_abi_cxx11_((string *)auStack_418,(Type *)auStack_88);
    plVar33 = (long *)std::__cxx11::string::replace
                                ((ulong)auStack_418,0,(char *)0x0,onlyListInput.field_2._8_8_);
    pFVar42 = (Function *)(plVar33 + 2);
    if ((Function *)*plVar33 == pFVar42) {
      secondaryMemorySizeString._M_string_length =
           (pFVar42->super_Importable).super_Named.name.super_IString.str._M_len;
      secondaryMemorySizeString.field_2._M_allocated_capacity = plVar33[3];
      auStack_248 = (undefined1  [8])&secondaryMemorySizeString._M_string_length;
    }
    else {
      secondaryMemorySizeString._M_string_length =
           (pFVar42->super_Importable).super_Named.name.super_IString.str._M_len;
      auStack_248 = (undefined1  [8])*plVar33;
    }
    secondaryMemorySizeString._M_dataplus._M_p = (pointer)plVar33[1];
    *plVar33 = (long)pFVar42;
    plVar33[1] = 0;
    *(undefined1 *)(plVar33 + 2) = 0;
    if (auStack_418 != (undefined1  [8])local_408) {
      operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
    }
    s._M_str = (char *)0x0;
    s._M_len = (size_t)auStack_248;
    reuse = SUB81(pFVar42,0);
    sVar59 = IString::interned((IString *)secondaryMemorySizeString._M_dataplus._M_p,s,(bool)reuse);
    psVar34 = (string_view *)
              std::__detail::
              _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&local_720,
                           (key_type *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
    *psVar34 = sVar59;
    s_00._M_str = (char *)0x0;
    s_00._M_len = (size_t)auStack_248;
    _auStack_418 = (_Any_data)
                   IString::interned((IString *)secondaryMemorySizeString._M_dataplus._M_p,s_00,
                                     (bool)reuse);
    pmVar35 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Type>,_std::allocator<std::pair<const_wasm::Name,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Type>,_std::allocator<std::pair<const_wasm::Name,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&local_6e8,(key_type *)auStack_418);
    pmVar35->id = renamings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    s_01._M_str = (char *)0x0;
    s_01._M_len = (size_t)auStack_248;
    sVar59 = IString::interned((IString *)secondaryMemorySizeString._M_dataplus._M_p,s_01,
                               SUB81(renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,0));
    sVar9 = renamings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pEVar36 = LiteralUtils::makeZero
                        ((Type)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (Module *)analysis_1._48_8_);
    psVar34 = (string_view *)operator_new(0x50);
    p_Var51 = (_Any_data *)analysis_1._48_8_;
    psVar34[4]._M_len = 0;
    psVar34[4]._M_str = (char *)0x0;
    psVar34[3]._M_len = 0;
    psVar34[3]._M_str = (char *)0x0;
    psVar34[2]._M_len = 0;
    psVar34[2]._M_str = (char *)0x0;
    psVar34[1]._M_len = 0;
    psVar34[1]._M_str = (char *)0x0;
    psVar34->_M_len = 0;
    psVar34->_M_str = (char *)0x0;
    auStack_418 = (undefined1  [8])psVar34;
    *psVar34 = sVar59;
    psVar34[3]._M_str = (char *)sVar9;
    psVar34[4]._M_len = (size_t)pEVar36;
    *(undefined1 *)&psVar34[4]._M_str = 1;
    Module::addGlobal((Module *)analysis_1._48_8_,
                      (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_418);
    if (auStack_418 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_418,0x50);
    }
    if (auStack_248 != (undefined1  [8])&secondaryMemorySizeString._M_string_length) {
      operator_delete((void *)auStack_248,secondaryMemorySizeString._M_string_length + 1);
    }
  }
  std::
  _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)auStack_508);
  if ((size_type *)onlyListInput.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)onlyListInput.field_2._8_8_,prefix._M_string_length + 1);
  }
  local_6b0 = local_31;
  local_948.field_2._M_allocated_capacity._0_4_ = 0x6f6d6572;
  local_948.field_2._M_allocated_capacity._4_2_ = 0x6576;
  local_948._M_string_length = 6;
  local_948.field_2._M_local_buf[6] = '\0';
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  anon_unknown_0::PatternMatcher::PatternMatcher
            ((PatternMatcher *)auStack_418,&local_948,(Module *)p_Var51,&local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,
                    CONCAT17(local_948.field_2._M_local_buf[7],
                             CONCAT16(local_948.field_2._M_local_buf[6],
                                      CONCAT24(local_948.field_2._M_allocated_capacity._4_2_,
                                               local_948.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_928.field_2._M_allocated_capacity._0_4_ = 0x646461;
  local_928._M_string_length = 3;
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  anon_unknown_0::PatternMatcher::PatternMatcher
            ((PatternMatcher *)((long)&onlyListInput.field_2 + 8),&local_928,(Module *)p_Var51,
             &local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,
                    CONCAT44(local_928.field_2._M_allocated_capacity._4_4_,
                             local_928.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_908.field_2._M_allocated_capacity._0_4_ = 0x796c6e6f;
  local_908._M_string_length = 4;
  local_908.field_2._M_allocated_capacity._4_4_ =
       local_908.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  anon_unknown_0::PatternMatcher::PatternMatcher
            ((PatternMatcher *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_908,(Module *)p_Var51,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,
                    CONCAT44(local_908.field_2._M_allocated_capacity._4_4_,
                             local_908.field_2._M_allocated_capacity._0_4_) + 1);
  }
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&renamings;
  renamings._M_t._M_impl._0_4_ = 0;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar52 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)(p_Var51->_M_pod_data + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(pointer *)(p_Var51->_M_pod_data + 0x20);
  renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (puVar52 != puVar7) {
    do {
      _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (puVar52->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>;
      if ((((key_type *)
           ((long)_Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20))->
          super_IString).str._M_len == wasm::(anonymous_namespace)::ASYNCIFY._8_8_) {
        sVar9 = (((key_type *)
                 ((long)_Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30))->
                super_IString).str._M_len;
        if (sVar9 == wasm::(anonymous_namespace)::START_UNWIND._8_8_) {
          pmVar37 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c48,
                                 (key_type *)
                                 _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          uVar55 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND;
          uVar56 = wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND._4_4_;
          uVar57 = (undefined4)DAT_010d1bf8;
          uVar58 = DAT_010d1bf8._4_4_;
        }
        else if (sVar9 == wasm::(anonymous_namespace)::STOP_UNWIND._8_8_) {
          pmVar37 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c48,
                                 (key_type *)
                                 _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          uVar55 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND;
          uVar56 = wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND._4_4_;
          uVar57 = (undefined4)DAT_010d1c08;
          uVar58 = DAT_010d1c08._4_4_;
        }
        else if (sVar9 == wasm::(anonymous_namespace)::START_REWIND._8_8_) {
          pmVar37 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c48,
                                 (key_type *)
                                 _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          uVar55 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND;
          uVar56 = wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND._4_4_;
          uVar57 = (undefined4)DAT_010d1c18;
          uVar58 = DAT_010d1c18._4_4_;
        }
        else {
          if (sVar9 != wasm::(anonymous_namespace)::STOP_REWIND._8_8_) {
            Fatal::Fatal((Fatal *)auStack_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&secondaryMemorySizeString._M_string_length,
                       "call to unidenfied asyncify import: ",0x24);
            Fatal::operator<<((Fatal *)auStack_248,
                              (Name *)((long)(puVar52->_M_t).
                                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                             .super__Head_base<0UL,_wasm::Function_*,_false> + 0x28)
                             );
            goto LAB_007cfa56;
          }
          pmVar37 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_c48,
                                 (key_type *)
                                 _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          uVar55 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND;
          uVar56 = wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND._4_4_;
          uVar57 = (undefined4)DAT_010d1c28;
          uVar58 = DAT_010d1c28._4_4_;
        }
        *(undefined4 *)&(pmVar37->super_IString).str._M_len = uVar55;
        *(undefined4 *)((long)&(pmVar37->super_IString).str._M_len + 4) = uVar56;
        *(undefined4 *)&(pmVar37->super_IString).str._M_str = uVar57;
        *(undefined4 *)((long)&(pmVar37->super_IString).str._M_str + 4) = uVar58;
      }
      puVar52 = puVar52 + 1;
    } while (puVar52 != puVar7);
  }
  wasm::ModuleUtils::
  renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
            ((Module *)p_Var51,
             (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              *)local_c48);
  local_788 = (long *)0x0;
  uStack_780 = 0;
  local_778 = (code *)0x0;
  pcStack_770 = (code *)0x0;
  local_788 = (long *)operator_new(0x20);
  *local_788 = (long)&local_568;
  local_788[1] = (long)&local_31;
  local_788[2] = (long)p_Var51;
  local_788[3] = (long)&__range4 + 4;
  local_288._M_unused._M_object = &local_788;
  pcStack_770 = std::
                _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:584:15)>
                ::_M_invoke;
  local_778 = std::
              _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:584:15)>
              ::_M_manager;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcStack_270 = std::
                _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h:363:48)>
                ::_M_invoke;
  local_278 = std::
              _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h:363:48)>
              ::_M_manager;
  analysis_1._8_8_ = (ulong)(uint)analysis_1._12_4_ << 0x20;
  analysis_1._16_8_ = 0;
  analysis_1._24_8_ = &analysis_1.field_0x8;
  analysis_1._40_8_ = 0;
  puVar52 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)(p_Var51->_M_pod_data + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(pointer *)(p_Var51->_M_pod_data + 0x20);
  local_288._8_8_ = p_Var51;
  local_c0 = p_Var51;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  auStack_88 = (undefined1  [8])p_Var51;
  analysis_1._32_8_ = analysis_1._24_8_;
  if (puVar52 != puVar7) {
    do {
      auStack_248 = *(undefined1 (*) [8])
                     &(puVar52->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>;
      std::
      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    *)&analysis_1,(key_type *)auStack_248);
      puVar52 = puVar52 + 1;
    } while (puVar52 != puVar7);
  }
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
  function((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_2a8,
           (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_288);
  puVar52 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)((long)auStack_88 + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(pointer *)((long)auStack_88 + 0x20);
  if (puVar52 != puVar7) {
    do {
      _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (puVar52->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>;
      if (*(long *)((long)_Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20)
          != 0) {
        auStack_508 = (undefined1  [8])
                      _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pmVar38 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                *)&analysis_1,(key_type *)auStack_508);
        auStack_248 = (undefined1  [8])
                      _Var8.super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (local_298 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_290)(&local_2a8,auStack_248,pmVar38);
      }
      puVar52 = puVar52 + 1;
    } while (puVar52 != puVar7);
  }
  auVar50 = auStack_88;
  local_258 = &PTR__PassRunner_01091270;
  auStack_508 = (undefined1  [8])&PTR__PassRunner_01091270;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)auStack_88;
  instrumentedFuncs._M_h._M_bucket_count = (long)auStack_88 + 0x200;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  instrumentedFuncs._M_h._M_element_count._0_4_ = 0;
  instrumentedFuncs._M_h._M_element_count._4_4_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._1_7_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0x101;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  instrumentedFuncs._M_h._M_single_bucket._0_4_ = 0;
  instrumentedFuncs._M_h._M_single_bucket._4_4_ = 2;
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
  function((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_338,
           (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *
           )&local_2a8);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::
  Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::
  Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info&)>)::Mapper::Mapper(wasm::Module&,std
  ::map<wasm::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info,std::less<wasm::
  Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
  ModuleAnalyzer::Info>>>&,std::function<void(wasm::Function*,wasm::(anonymous_namespace)::
  ModuleAnalyzer::Info__>_(auStack_248,(Module *)auVar50,(Map *)&analysis_1,(Func *)&local_338);
  if (secondaryMemorySizeString._M_dataplus._M_p != auStack_508 &&
      secondaryMemorySizeString._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                  ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
  }
  auVar50 = auStack_88;
  secondaryMemorySizeString._M_dataplus._M_p = auStack_508;
  (**(code **)((long)auStack_248 + 0x10))();
  p_Var16 = &local_b8._M_t._M_impl.super__Rb_tree_header;
  auStack_248 = (undefined1  [8])&PTR__Mapper_01091578;
  if (local_f8 != (code *)0x0) {
    auVar50 = (undefined1  [8])&local_108;
    (*local_f8)(auVar50,auVar50,3);
  }
  if (local_140 != (void *)0x0) {
    auVar50 = (undefined1  [8])(local_130 - (long)local_140);
    operator_delete(local_140,(ulong)auVar50);
  }
  Pass::~Pass((Pass *)auStack_248);
  if (local_328 != (code *)0x0) {
    auVar50 = (undefined1  [8])&local_338;
    (*local_328)(auVar50,auVar50,3);
  }
  PassRunner::~PassRunner((PassRunner *)auStack_508);
  if (local_298 != (code *)0x0) {
    auVar50 = (undefined1  [8])&local_2a8;
    (*local_298)(auVar50,auVar50,3);
  }
  if (local_278 != (code *)0x0) {
    auVar50 = (undefined1  [8])&local_288;
    (*local_278)(auVar50,auVar50,3);
  }
  uVar22 = analysis_1._32_8_;
  uVar21 = analysis_1._24_8_;
  uVar20 = analysis_1._16_8_;
  p_Var41 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    if (analysis_1._16_8_ != 0) {
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = analysis_1._8_4_;
      *(_Rb_tree_header **)(analysis_1._16_8_ + 8) = p_Var16;
      p_Var32 = (_Rb_tree_node_base *)0x0;
      analysis_1._16_8_ = 0;
      p_Var41 = (_Base_ptr)&analysis_1.field_0x8;
      analysis_1._24_8_ = p_Var41;
      analysis_1._32_8_ = p_Var41;
      goto LAB_007cdf1c;
    }
  }
  else if (analysis_1._16_8_ == 0) {
    analysis_1._8_4_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    analysis_1._16_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    analysis_1._24_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    analysis_1._32_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    *(undefined1 **)
     &((_Rb_tree_header *)
      &(local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
         &analysis_1.field_0x8;
    analysis_1._40_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var16->_M_header;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var16->_M_header;
  }
  else {
    analysis_1._16_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Rb_tree_header **)(uVar20 + 8) = p_Var16;
    *(undefined1 **)
     &((_Rb_tree_header *)
      &(local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
         &analysis_1.field_0x8;
    p_Var32 = (_Rb_tree_node_base *)local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var41 = (_Base_ptr)analysis_1._40_8_;
    analysis_1._24_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    analysis_1._32_8_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_007cdf1c:
    local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = analysis_1._40_8_;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar22;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uVar21;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)uVar20;
    analysis_1._40_8_ = p_Var32;
  }
  if ((_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var16) {
    p_Var39 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var32 = *(_Rb_tree_node_base **)(p_Var39 + 2);
      if (p_Var32 != (_Rb_tree_node_base *)&p_Var39[1]._M_left) {
        do {
          auStack_248 = *(undefined1 (*) [8])(p_Var32 + 1);
          pmVar38 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[](&local_b8,(key_type *)auStack_248);
          auVar50 = (undefined1  [8])(p_Var39 + 1);
          std::
          _Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
          ::_M_insert_unique<wasm::Function*const&>
                    ((_Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
                      *)&(pmVar38->super_FunctionInfo).calledBy,(Function **)(p_Var39 + 1));
          p_Var32 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var32);
        } while (p_Var32 != (_Rb_tree_node_base *)&p_Var39[1]._M_left);
      }
      p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
    } while ((_Rb_tree_header *)p_Var39 != &local_b8._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var16 = &local_b8._M_t._M_impl.super__Rb_tree_header;
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)analysis_1._16_8_,(_Link_type)auVar50);
  if (local_778 != (code *)0x0) {
    (*local_778)(&local_788,&local_788,3);
  }
  if ((_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var16) {
    p_Var39 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bVar24 = anon_unknown_0::PatternMatcher::match
                         ((PatternMatcher *)auStack_418,(Name)(*(IString **)(p_Var39 + 1))->str);
      if (bVar24) {
        *(byte *)((long)&p_Var39[5]._M_color + 3) = 1;
        if ((local_31 == '\x01') && ((char)p_Var39[5]._M_color == _S_black)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[asyncify] ",0xb);
          name.super_IString.str._M_str = (char *)p_Var41;
          name.super_IString.str._M_len = (*(undefined8 **)(p_Var39 + 1))[1];
          poVar40 = wasm::operator<<((wasm *)&std::cout,(ostream *)**(undefined8 **)(p_Var39 + 1),
                                     name);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar40," is in the remove-list, ignore\n",0x1f);
        }
        *(undefined1 *)&p_Var39[5]._M_color = _S_red;
      }
      p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
    } while ((_Rb_tree_header *)p_Var39 != p_Var16);
  }
  pNStack_2e8 = (pointer)0x0;
  funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((_Rb_tree_header *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var16) {
    p_Var41 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __args = *(Name **)(p_Var41 + 1);
      sVar9 = __args[2].super_IString.str._M_len;
      if ((sVar9 != 0) && (sVar9 == wasm::(anonymous_namespace)::ASYNCIFY._8_8_)) {
        if (funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start ==
            funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&pNStack_2e8,
                     (iterator)
                     funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                     _M_impl.super__Vector_impl_data._M_start,__args);
        }
        else {
          pcVar10 = (__args->super_IString).str._M_str;
          ((funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_len =
               (__args->super_IString).str._M_len;
          ((funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar10;
          funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start =
               funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      auStack_248 = (undefined1  [8])0x0;
      secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
      secondaryMemorySizeString._M_string_length = 0;
      p_Var32 = *(_Rb_tree_node_base **)(p_Var41 + 2);
      auVar50 = auStack_248;
      __position._M_current = (Function **)secondaryMemorySizeString._M_dataplus._M_p;
      while (auStack_248 = auVar50,
            secondaryMemorySizeString._M_dataplus._M_p = (pointer)__position._M_current,
            p_Var32 != (_Rb_tree_node_base *)&p_Var41[1]._M_left) {
        auStack_508 = *(undefined1 (*) [8])(p_Var32 + 1);
        pcVar10 = (((Function *)auStack_508)->super_Importable).module.super_IString.str._M_str;
        if ((pcVar10 != (char *)0x0) &&
           (pcVar10 == (char *)wasm::(anonymous_namespace)::ASYNCIFY._8_8_)) {
          if (__position._M_current == (Function **)secondaryMemorySizeString._M_string_length) {
            std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
            _M_realloc_insert<wasm::Function*const&>
                      ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)auStack_248,
                       __position,(Function **)auStack_508);
          }
          else {
            *__position._M_current = (Function *)auStack_508;
            secondaryMemorySizeString._M_dataplus._M_p = (pointer)(__position._M_current + 1);
          }
        }
        p_Var32 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var32);
        auVar50 = auStack_248;
        __position._M_current = (Function **)secondaryMemorySizeString._M_dataplus;
      }
      if (auVar50 != (undefined1  [8])__position._M_current) {
        do {
          auStack_508 = *(undefined1 (*) [8])auVar50;
          pVar60 = std::
                   _Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   ::equal_range((_Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                                  *)&p_Var41[1]._M_parent,(key_type *)auStack_508);
          std::
          _Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::_M_erase_aux((_Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                          *)&p_Var41[1]._M_parent,(_Base_ptr)pVar60.first._M_node,
                         (_Base_ptr)pVar60.second._M_node);
          auVar50 = (undefined1  [8])((long)auVar50 + 8);
        } while (auVar50 != (undefined1  [8])__position._M_current);
      }
      if (auStack_248 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_248,
                        secondaryMemorySizeString._M_string_length - (long)auStack_248);
      }
      p_Var41 = (_Base_ptr)std::_Rb_tree_increment(p_Var41);
    } while ((_Rb_tree_header *)p_Var41 != &local_b8._M_t._M_impl.super__Rb_tree_header);
  }
  uVar20 = analysis_1._48_8_;
  pNVar18 = funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start;
  p_Var16 = &local_b8._M_t._M_impl.super__Rb_tree_header;
  for (pNVar49 = pNStack_2e8; pNVar49 != pNVar18; pNVar49 = pNVar49 + 1) {
    Module::removeFunction((Module *)uVar20,(Name)(pNVar49->super_IString).str);
  }
  auStack_508 = (undefined1  [8])&local_528;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)uVar20;
  instrumentedFuncs._M_h._M_bucket_count =
       (size_type)(&onlyListInput.field_2._M_allocated_capacity + 1);
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auStack_418;
  instrumentedFuncs._M_h._M_element_count = (size_type)&local_31;
  if ((char)local_250 != '\0') {
    anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer::anon_class_40_5_a2539eac::operator()
              ((anon_class_40_5_a2539eac *)auStack_508,&local_b8);
  }
  local_288._8_8_ = auStack_588;
  auStack_588 = (undefined1  [8])0x0;
  loggings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loggings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  analysis_1.wasm = (Module *)0x0;
  analysis_1._16_8_ =
       std::
       _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:722:27)>
       ::_M_invoke;
  analysis_1._8_8_ =
       std::
       _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:722:27)>
       ::_M_manager;
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = std::
              _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:723:27)>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:723:27)>
              ::_M_manager;
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_290 = std::
              _Function_handler<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:727:27)>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:727:27)>
              ::_M_manager;
  pcStack_270 = std::
                _Function_handler<void_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:728:27)>
                ::_M_invoke;
  local_278 = std::
              _Function_handler<void_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:728:27)>
              ::_M_manager;
  secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
  secondaryMemorySizeString.field_2._9_7_ = 0;
  secondaryMemorySizeString._M_string_length = 0;
  secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
  auStack_248 = (undefined1  [8])0x0;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
  item._M_head_impl = (Function *)0x0;
  local_288._M_unused._M_object = &local_31;
  std::_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::_M_initialize_map
            ((_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_248,0);
  auStack_1f8 = (undefined1  [8])&_Stack_1c8;
  local_1f0 = true;
  uStack_1ef = 0;
  local_1e8._M_value = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  uStack_1e0 = 0;
  local_1d8 = 1.0;
  local_1d0 = (__buckets_ptr)0x0;
  _Stack_1c8._M_nxt = (_Hash_node_base *)0x0;
  puVar52 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)((long)local_c0 + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(pointer *)(local_c0 + 2);
  if (puVar52 != puVar7) {
    do {
      local_2c8._M_head_impl =
           (puVar52->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      item._M_head_impl =
           (Function *)
           std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::operator[](&local_b8,&local_2c8._M_head_impl);
      if (analysis_1._8_8_ == 0) {
        std::__throw_bad_function_call();
      }
      cVar27 = (*(code *)analysis_1._16_8_)(auStack_88);
      if (cVar27 != '\0') {
        local_2c8._M_head_impl =
             (puVar52->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pmVar38 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  ::operator[](&local_b8,&local_2c8._M_head_impl);
        if (local_298 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        (*local_290)(&local_2a8,pmVar38);
        item._M_head_impl =
             (puVar52->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        UniqueDeferredQueue<wasm::Function_*>::push
                  ((UniqueDeferredQueue<wasm::Function_*> *)auStack_248,item._M_head_impl);
      }
      puVar52 = puVar52 + 1;
    } while (puVar52 != puVar7);
  }
  while ((long)(CONCAT71(secondaryMemorySizeString.field_2._9_7_,
                         secondaryMemorySizeString.field_2._M_local_buf[8]) -
               secondaryMemorySizeString._M_string_length) >> 3 != 0) {
    pFVar42 = UniqueDeferredQueue<wasm::Function_*>::pop
                        ((UniqueDeferredQueue<wasm::Function_*> *)auStack_248);
    item._M_head_impl = (Function *)local_b38;
    local_b38 = (undefined1  [8])pFVar42;
    pmVar38 = std::
              map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              ::operator[](&local_b8,(key_type *)item._M_head_impl);
    p_Var32 = (pmVar38->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    while ((_Rb_tree_header *)p_Var32 !=
           &(pmVar38->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header) {
      p_Var51 = *(_Any_data **)(p_Var32 + 1);
      local_2f0 = p_Var51;
      item._M_head_impl =
           (Function *)
           std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::operator[](&local_b8,(key_type *)&local_2f0);
      if (local_328 == (code *)0x0) goto LAB_007cf66a;
      cVar27 = (*local_320)();
      if (cVar27 != '\0') {
        pmVar43 = std::
                  map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                  ::operator[](&local_b8,(key_type *)&local_2f0);
        local_2c8._M_head_impl = pFVar42;
        if (local_278 == (code *)0x0) {
LAB_007cf66a:
          std::__throw_bad_function_call();
        }
        (*pcStack_270)(&local_288,pmVar43,&local_2c8);
        item._M_head_impl =
             (Function *)
             std::
             map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
             ::operator[](&local_b8,(key_type *)&local_2f0);
        if (analysis_1._8_8_ == 0) goto LAB_007cf66a;
        cVar27 = (*(code *)analysis_1._16_8_)();
        if (cVar27 == '\0') {
          pmVar43 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[](&local_b8,(key_type *)&local_2f0);
          if (local_298 == (code *)0x0) goto LAB_007cf66a;
          (*local_290)(&local_2a8,pmVar43);
          UniqueDeferredQueue<wasm::Function_*>::push
                    ((UniqueDeferredQueue<wasm::Function_*> *)auStack_248,(Function *)p_Var51);
          item._M_head_impl = (Function *)p_Var51;
        }
      }
      p_Var32 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var32);
    }
  }
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)auStack_1f8);
  std::_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Deque_base
            ((_Deque_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_248);
  if (local_278 != (code *)0x0) {
    item._M_head_impl = (Function *)&local_288;
    (*local_278)(item._M_head_impl,item._M_head_impl,3);
  }
  if (local_298 != (code *)0x0) {
    item._M_head_impl = (Function *)&local_2a8;
    (*local_298)(item._M_head_impl,item._M_head_impl,3);
  }
  if (local_328 != (code *)0x0) {
    item._M_head_impl = (Function *)&local_338;
    (*local_328)(item._M_head_impl,item._M_head_impl,3);
  }
  if (analysis_1._8_8_ != 0) {
    item._M_head_impl = (Function *)auStack_88;
    (*(code *)analysis_1._8_8_)(item._M_head_impl,item._M_head_impl,3);
  }
  p_Var51 = (_Any_data *)
            loggings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar50 = auStack_588;
  if (auStack_588 !=
      (undefined1  [8])
      loggings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar44 = (long)loggings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_588 >> 5;
    lVar30 = 0x3f;
    if (uVar44 != 0) {
      for (; uVar44 >> lVar30 == 0; lVar30 = lVar30 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (auStack_588,
               loggings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,((uint)lVar30 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar50);
    pbVar17 = loggings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    item._M_head_impl = (Function *)p_Var51;
    for (auVar50 = auStack_588; auVar50 != (undefined1  [8])pbVar17;
        auVar50 = (undefined1  [8])((long)auVar50 + 0x20)) {
      item._M_head_impl = (Function *)(((pointer)auVar50)->_M_dataplus)._M_p;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)item._M_head_impl,
                 ((pointer)auVar50)->_M_string_length);
    }
  }
  p_Var19 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  p_Var39 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var41 = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_748 == (_Base_ptr)0x0) {
    p_Var32 = (_Rb_tree_node_base *)0x0;
    if (local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
    goto LAB_007ce7d6;
    local_758._8_4_ = local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    p_Var32 = (_Rb_tree_node_base *)(local_758 + 8);
    *(_Rb_tree_node_base **)
     &((_Rb_tree_header *)
      &(local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->_M_header =
         p_Var32;
    p_Var45 = (_Rb_tree_node_base *)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var16->_M_header;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var16->_M_header;
  }
  else {
    if (local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_758._8_4_;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_748;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_740;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_738;
      *(_Rb_tree_header **)&((_Rb_tree_header *)&local_748->_M_parent)->_M_header = p_Var16;
      local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_730;
      local_748 = (_Base_ptr)0x0;
      p_Var32 = (_Rb_tree_node_base *)(local_758 + 8);
      local_730 = (_Rb_tree_node_base *)0x0;
      local_740 = p_Var32;
      p_Stack_738 = p_Var32;
      goto LAB_007ce7d6;
    }
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_748;
    *(undefined1 **)&((_Rb_tree_header *)&p_Var41->_M_parent)->_M_header = local_758 + 8;
    *(_Rb_tree_header **)&((_Rb_tree_header *)&local_748->_M_parent)->_M_header = p_Var16;
    p_Var45 = local_730;
    p_Var32 = (_Rb_tree_node_base *)local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_740;
    local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_738;
  }
  local_730 = (_Rb_tree_node_base *)local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Stack_738 = p_Var19;
  local_740 = p_Var39;
  local_748 = p_Var41;
  local_b8._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var45;
LAB_007ce7d6:
  if (local_318.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_318.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    plVar33 = *(long **)(analysis_1._48_8_ + 0x18);
    plVar11 = *(long **)(analysis_1._48_8_ + 0x20);
    if (plVar33 != plVar11) {
      do {
        if (*(long *)((_func_void *)*plVar33 + 0x20) == 0) {
          auStack_248 = (undefined1  [8])*plVar33;
          pmVar38 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                  *)local_758,(key_type *)auStack_248);
          item._M_head_impl = *(Function **)&((IString *)*plVar33)->str;
          bVar24 = anon_unknown_0::PatternMatcher::match
                             ((PatternMatcher *)
                              &renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (Name)((IString *)*plVar33)->str);
          pmVar38->canChangeState = bVar24;
          if (bVar24) {
            pmVar38->addedFromList = true;
          }
          if (local_31 == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[asyncify] ",0xb);
            name_00.super_IString.str._M_str = (char *)p_Var32;
            name_00.super_IString.str._M_len = ((undefined8 *)*plVar33)[1];
            poVar40 = wasm::operator<<((wasm *)&std::cout,*(ostream **)*plVar33,name_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar40,"\'s state is set based on the only-list to ",0x2a);
            poVar40 = std::ostream::_M_insert<bool>(SUB81(poVar40,0));
            auStack_248[0] = 10;
            item._M_head_impl = (Function *)auStack_248;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar40,((_Any_data *)auStack_248)->_M_pod_data,1);
          }
        }
        plVar33 = plVar33 + 1;
      } while (plVar33 != plVar11);
    }
  }
  pAVar23 = pAStack_40;
  if ((char)local_250 == '\0') {
    item._M_head_impl = (Function *)local_758;
    anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer::anon_class_40_5_a2539eac::operator()
              ((anon_class_40_5_a2539eac *)auStack_508,(Map *)item._M_head_impl);
  }
  anon_unknown_0::PatternMatcher::checkPatternsMatches((PatternMatcher *)auStack_418);
  anon_unknown_0::PatternMatcher::checkPatternsMatches
            ((PatternMatcher *)((long)&onlyListInput.field_2 + 8));
  anon_unknown_0::PatternMatcher::checkPatternsMatches
            ((PatternMatcher *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_588);
  uVar20 = analysis_1._48_8_;
  if (pNStack_2e8 != (pointer)0x0) {
    item._M_head_impl =
         (Function *)
         ((long)funcsToDelete.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pNStack_2e8);
    operator_delete(pNStack_2e8,(ulong)item._M_head_impl);
  }
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)local_b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)item._M_head_impl);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_c48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_b98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_bc8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_bf8);
  if ((long *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count != local_c08) {
    operator_delete((void *)renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_c08[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xfffffffffffffa48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffa18);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffff9e8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)((long)&prefix.field_2 + 8));
  if ((size_type *)onlyListInput.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)onlyListInput.field_2._8_8_,prefix._M_string_length + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_368);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_398);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_3c8);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_3f8);
  if (auStack_418 != (undefined1  [8])local_408) {
    operator_delete((void *)auStack_418,(ulong)(local_408._0_8_ + 1));
  }
  if (local_558 != (pointer)0x0) {
    (*(code *)local_558)(&local_568,&local_568,3);
  }
  addGlobals(pAVar23,(Module *)uVar20,(bool)__range4._6_1_);
  auStack_508 = (undefined1  [8])&instrumentedFuncs._M_h._M_rehash_policy._M_next_resize;
  instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  instrumentedFuncs._M_h._M_bucket_count = 0;
  instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  instrumentedFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._1_7_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._0_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._1_2_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._3_1_ = 0;
  instrumentedFuncs._M_h._M_rehash_policy._M_next_resize._4_4_ = 0;
  puVar54 = *(undefined8 **)(uVar20 + 0x18);
  puVar12 = *(undefined8 **)(uVar20 + 0x20);
  if (puVar54 != puVar12) {
    do {
      auStack_248 = (undefined1  [8])*puVar54;
      pmVar38 = std::
                map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                              *)local_758,(key_type *)auStack_248);
      if ((pmVar38->canChangeState == true) && ((pmVar38->isTopMostRuntime & 1U) == 0)) {
        auStack_418 = (undefined1  [8])*puVar54;
        auStack_248 = (undefined1  [8])auStack_508;
        std::
        _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<wasm::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                  ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)auStack_248,auStack_418,auStack_248);
      }
      puVar54 = puVar54 + 1;
    } while (puVar54 != puVar12);
  }
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)analysis_1._48_8_;
  local_250 = analysis_1._48_8_ + 0x200;
  secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
  secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
  secondaryMemorySizeString.field_2._9_7_ = 0;
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1d8 = (float)((uint)local_1d8 & 0xffffff00);
  auStack_1f8[0] = false;
  auStack_1f8[1] = false;
  auStack_1f8[2] = false;
  auStack_1f8[3] = false;
  auStack_1f8[4] = false;
  auStack_1f8[5] = false;
  auStack_1f8[6] = false;
  auStack_1f8[7] = false;
  local_1f0 = false;
  _Stack_1c8._M_nxt = (_Hash_node_base *)0x1;
  local_1c0._M_nxt = (_Hash_node_base *)0x0;
  sStack_1b8 = 0;
  local_1b0 = 1.0;
  local_1a8 = 0;
  p_Stack_1a0 = (__node_base_ptr)0x0;
  local_190 = 1;
  local_188._M_nxt = (_Hash_node_base *)0x0;
  sStack_180 = 0;
  local_178 = 1.0;
  local_170 = 0;
  _Stack_168._M_nxt = (_Hash_node_base *)0x0;
  local_160 = 0;
  auStack_248 = (undefined1  [8])&PTR__PassRunner_010916f8;
  local_158 = auStack_508;
  stateChangingImports.field_2._8_8_ = &stack0xfffffffffffff768;
  secondaryMemorySizeString._M_string_length = local_250;
  local_1d0 = &p_Stack_1a0;
  local_198 = &_Stack_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&stateChangingImports.field_2 + 8),"flatten","");
  local_a90 = false;
  PassRunner::add((PassRunner *)auStack_248,(string *)((long)&stateChangingImports.field_2 + 8),
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_ab0);
  if ((local_a90 == true) &&
     (local_a90 = false,
     local_ab0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_ab0._M_value + 0x10))) {
    operator_delete((void *)local_ab0._M_value._M_dataplus._M_p,local_ab0._16_8_ + 1);
  }
  if ((long *)stateChangingImports.field_2._8_8_ != &stack0xfffffffffffff768) {
    operator_delete((void *)stateChangingImports.field_2._8_8_,local_898 + 1);
  }
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"dce","");
  local_a68 = false;
  PassRunner::add((PassRunner *)auStack_248,&local_888,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a88);
  if ((local_a68 == true) &&
     (local_a68 = false,
     local_a88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a88._M_value + 0x10))) {
    operator_delete((void *)local_a88._M_value._M_dataplus._M_p,local_a88._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  iVar53 = local_25c;
  if (0 < local_25c) {
    local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"remove-unused-names","");
    local_a40 = false;
    PassRunner::add((PassRunner *)auStack_248,&local_868,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a60);
    if ((local_a40 == true) &&
       (local_a40 = false,
       local_a60._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a60._M_value + 0x10))) {
      operator_delete((void *)local_a60._M_value._M_dataplus._M_p,local_a60._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868._M_dataplus._M_p != &local_868.field_2) {
      operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
    }
    local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_848,"simplify-locals-nonesting","");
    local_a18 = '\0';
    PassRunner::add((PassRunner *)auStack_248,&local_848,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a38._M_value);
    if ((local_a18 == '\x01') &&
       (local_a18 = '\0', local_a38._M_value._M_dataplus._M_p != (pointer)((long)&local_a38 + 0x10))
       ) {
      operator_delete((void *)local_a38._M_value._M_dataplus._M_p,local_a38._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_848._M_dataplus._M_p != &local_848.field_2) {
      operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
    }
    local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"reorder-locals","");
    local_9f0 = false;
    PassRunner::add((PassRunner *)auStack_248,&local_828,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_a10);
    if ((local_9f0 == true) &&
       (local_9f0 = false,
       local_a10._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a10._M_value + 0x10))) {
      operator_delete((void *)local_a10._M_value._M_dataplus._M_p,local_a10._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_dataplus._M_p != &local_828.field_2) {
      operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
    }
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"coalesce-locals","");
    local_9c8 = false;
    PassRunner::add((PassRunner *)auStack_248,&local_808,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9e8);
    if ((local_9c8 == true) &&
       (local_9c8 = false,
       local_9e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9e8._M_value + 0x10))) {
      operator_delete((void *)local_9e8._M_value._M_dataplus._M_p,local_9e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7e8,"simplify-locals-nonesting","");
    local_9a0 = false;
    PassRunner::add((PassRunner *)auStack_248,&local_7e8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9c0);
    if ((local_9a0 == true) &&
       (local_9a0 = false,
       local_9c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9c0._M_value + 0x10))) {
      operator_delete((void *)local_9c0._M_value._M_dataplus._M_p,local_9c0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
      operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
    }
    local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"reorder-locals","");
    local_978 = false;
    PassRunner::add((PassRunner *)auStack_248,&local_7c8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_998);
    if ((local_978 == true) &&
       (local_978 = false,
       local_998._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_998._M_value + 0x10))) {
      operator_delete((void *)local_998._M_value._M_dataplus._M_p,local_998._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"merge-blocks","");
    local_950 = false;
    PassRunner::add((PassRunner *)auStack_248,&local_7a8,
                    (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_970);
    if ((local_950 == true) &&
       (local_950 = false,
       local_970._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_970._M_value + 0x10))) {
      operator_delete((void *)local_970._M_value._M_dataplus._M_p,local_970._16_8_ + 1);
    }
    iVar53 = local_25c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
      operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
    }
  }
  local_2c0._M_nxt = (_Hash_node_base *)operator_new(0x98);
  p_Var13 = (_Hash_node_base *)(pAStack_40->asyncifyMemory).super_IString.str._M_str;
  local_2c0._M_nxt[1]._M_nxt = (_Hash_node_base *)0x0;
  local_2c0._M_nxt[2]._M_nxt = local_2c0._M_nxt + 4;
  local_2c0._M_nxt[3]._M_nxt = (_Hash_node_base *)0x0;
  *(undefined1 *)&local_2c0._M_nxt[4]._M_nxt = 0;
  *(undefined1 *)&local_2c0._M_nxt[10]._M_nxt = 0;
  (local_2c0._M_nxt)->_M_nxt = (_Hash_node_base *)&PTR__AsyncifyFlow_010915d8;
  local_2c0._M_nxt[0xb]._M_nxt = (_Hash_node_base *)local_768;
  p_Var14 = (_Hash_node_base *)(pAStack_40->asyncifyMemory).super_IString.str._M_len;
  local_2c0._M_nxt[0xc]._M_nxt = (_Hash_node_base *)(pAStack_40->pointerType).id;
  local_2c0._M_nxt[0xd]._M_nxt = p_Var14;
  local_2c0._M_nxt[0xe]._M_nxt = p_Var13;
  local_2c0._M_nxt[0xf]._M_nxt = (_Hash_node_base *)0x0;
  *(undefined4 *)&local_2c0._M_nxt[0x12]._M_nxt = 0;
  PassRunner::add((PassRunner *)auStack_248,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_2c0);
  if (local_2c0._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)(local_2c0._M_nxt)->_M_nxt[1]._M_nxt)();
  }
  local_2c0._M_nxt = (_Hash_node_base *)0x0;
  local_160._0_1_ = true;
  PassRunner::run((PassRunner *)auStack_248);
  PassRunner::~PassRunner((PassRunner *)auStack_248);
  if (__range4._7_1_ != '\0') {
    auStack_248 = (undefined1  [8])local_258;
    secondaryMemorySizeString._M_dataplus._M_p = (pointer)analysis_1._48_8_;
    secondaryMemorySizeString._M_string_length = local_250;
    secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
    secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
    secondaryMemorySizeString.field_2._9_7_ = 0;
    uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
    local_1d8 = (float)((uint)local_1d8 & 0xffffff00);
    auStack_1f8[0] = false;
    auStack_1f8[1] = false;
    auStack_1f8[2] = false;
    auStack_1f8[3] = false;
    auStack_1f8[4] = false;
    auStack_1f8[5] = false;
    auStack_1f8[6] = false;
    auStack_1f8[7] = false;
    local_1f0 = false;
    _Stack_1c8._M_nxt = (_Hash_node_base *)0x1;
    local_1c0._M_nxt = (_Hash_node_base *)0x0;
    sStack_1b8 = 0;
    local_1b0 = 1.0;
    local_1a8 = 0;
    p_Stack_1a0 = (__node_base_ptr)0x0;
    local_190 = 1;
    local_188._M_nxt = (_Hash_node_base *)0x0;
    sStack_180 = 0;
    local_178 = 1.0;
    local_170 = 0;
    _Stack_168._M_nxt = (_Hash_node_base *)0x0;
    local_160 = 0;
    local_1d0 = &p_Stack_1a0;
    local_198 = &_Stack_168;
    local_2b8._M_head_impl = (Pass *)operator_new(0x88);
    pcVar10 = (pAStack_40->asyncifyMemory).super_IString.str._M_str;
    (local_2b8._M_head_impl)->runner = (PassRunner *)0x0;
    ((local_2b8._M_head_impl)->name)._M_dataplus._M_p =
         (pointer)&((local_2b8._M_head_impl)->name).field_2;
    ((local_2b8._M_head_impl)->name)._M_string_length = 0;
    ((local_2b8._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
    ((local_2b8._M_head_impl)->passArg).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    (local_2b8._M_head_impl)->_vptr_Pass =
         (_func_int **)&PTR__AsyncifyAssertInNonInstrumented_01091638;
    local_2b8._M_head_impl[1]._vptr_Pass = (_func_int **)local_768;
    pcVar15 = (pointer)(pAStack_40->asyncifyMemory).super_IString.str._M_len;
    local_2b8._M_head_impl[1].runner = (PassRunner *)(pAStack_40->pointerType).id;
    local_2b8._M_head_impl[1].name._M_dataplus._M_p = pcVar15;
    local_2b8._M_head_impl[1].name._M_string_length = (size_type)pcVar10;
    local_2b8._M_head_impl[1].name.field_2._M_allocated_capacity = 0;
    PassRunner::add((PassRunner *)auStack_248,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_2b8);
    if (local_2b8._M_head_impl != (Pass *)0x0) {
      (*(local_2b8._M_head_impl)->_vptr_Pass[1])();
    }
    local_2b8._M_head_impl = (Pass *)0x0;
    local_160._0_1_ = true;
    PassRunner::run((PassRunner *)auStack_248);
    PassRunner::~PassRunner((PassRunner *)auStack_248);
  }
  pAVar23 = pAStack_40;
  secondaryMemorySizeString._M_dataplus._M_p = (pointer)analysis_1._48_8_;
  secondaryMemorySizeString._M_string_length = local_250;
  secondaryMemorySizeString.field_2._M_allocated_capacity = 0;
  secondaryMemorySizeString.field_2._M_local_buf[8] = '\0';
  secondaryMemorySizeString.field_2._9_7_ = 0;
  uStack_1e0 = uStack_1e0 & 0xffffffffffffff00;
  local_1d8 = (float)((uint)local_1d8 & 0xffffff00);
  auStack_1f8[0] = false;
  auStack_1f8[1] = false;
  auStack_1f8[2] = false;
  auStack_1f8[3] = false;
  auStack_1f8[4] = false;
  auStack_1f8[5] = false;
  auStack_1f8[6] = false;
  auStack_1f8[7] = false;
  local_1f0 = false;
  _Stack_1c8._M_nxt = (_Hash_node_base *)0x1;
  local_1c0._M_nxt = (_Hash_node_base *)0x0;
  sStack_1b8 = 0;
  local_1b0 = 1.0;
  local_1a8 = 0;
  p_Stack_1a0 = (__node_base_ptr)0x0;
  local_190 = 1;
  local_188._M_nxt = (_Hash_node_base *)0x0;
  sStack_180 = 0;
  local_178 = 1.0;
  local_170 = 0;
  _Stack_168._M_nxt = (_Hash_node_base *)0x0;
  local_160 = 0;
  auStack_248 = (undefined1  [8])&PTR__PassRunner_010916f8;
  local_158 = auStack_508;
  local_1d0 = &p_Stack_1a0;
  local_198 = &_Stack_168;
  if (0 < iVar53) {
    PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)auStack_248);
  }
  local_2b0._M_head_impl = (Pass *)operator_new(0x1c8);
  pcVar10 = (pAVar23->asyncifyMemory).super_IString.str._M_str;
  (local_2b0._M_head_impl)->runner = (PassRunner *)0x0;
  ((local_2b0._M_head_impl)->name)._M_dataplus._M_p =
       (pointer)&((local_2b0._M_head_impl)->name).field_2;
  ((local_2b0._M_head_impl)->name)._M_string_length = 0;
  ((local_2b0._M_head_impl)->name).field_2._M_local_buf[0] = '\0';
  ((local_2b0._M_head_impl)->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  local_2b0._M_head_impl[1]._vptr_Pass = (_func_int **)0x0;
  local_2b0._M_head_impl[1].runner = (PassRunner *)0x0;
  local_2b0._M_head_impl[3]._vptr_Pass = (_func_int **)0x0;
  local_2b0._M_head_impl[3].runner = (PassRunner *)0x0;
  local_2b0._M_head_impl[3].name._M_dataplus._M_p = (pointer)0x0;
  local_2b0._M_head_impl[3].name._M_string_length = 0;
  local_2b0._M_head_impl[3].name.field_2._M_allocated_capacity = 0;
  (local_2b0._M_head_impl)->_vptr_Pass = (_func_int **)&PTR__AsyncifyLocals_01091698;
  *(_Hash_node_base **)((long)&local_2b0._M_head_impl[3].name.field_2 + 8) =
       (_Hash_node_base *)local_768;
  sVar9 = (pAVar23->asyncifyMemory).super_IString.str._M_len;
  local_2b0._M_head_impl[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)(pAVar23->pointerType).id;
  local_2b0._M_head_impl[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = sVar9;
  *(char **)((long)&local_2b0._M_head_impl[3].passArg.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 0x10) = pcVar10;
  *(undefined8 *)
   ((long)&local_2b0._M_head_impl[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0;
  local_2b0._M_head_impl[4]._vptr_Pass = (_func_int **)&local_2b0._M_head_impl[4].passArg;
  local_2b0._M_head_impl[4].runner = (PassRunner *)0x1;
  local_2b0._M_head_impl[4].name._M_dataplus._M_p = (pointer)0x0;
  local_2b0._M_head_impl[4].name._M_string_length = 0;
  *(undefined4 *)&local_2b0._M_head_impl[4].name.field_2 = 0x3f800000;
  *(undefined8 *)((long)&local_2b0._M_head_impl[4].name.field_2 + 8) = 0;
  local_2b0._M_head_impl[4].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)0x0;
  pp_Var47 = (_func_int **)
             ((long)&local_2b0._M_head_impl[4].passArg.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
  *(undefined4 *)
   ((long)&local_2b0._M_head_impl[4].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&local_2b0._M_head_impl[4].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0;
  *(_func_int ***)
   &local_2b0._M_head_impl[4].passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = pp_Var47;
  local_2b0._M_head_impl[5]._vptr_Pass = pp_Var47;
  local_2b0._M_head_impl[5].runner = (PassRunner *)0x0;
  PassRunner::add((PassRunner *)auStack_248,
                  (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_2b0);
  if (local_2b0._M_head_impl != (Pass *)0x0) {
    (*(local_2b0._M_head_impl)->_vptr_Pass[1])();
  }
  local_2b0._M_head_impl = (Pass *)0x0;
  if (0 < iVar53) {
    PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)auStack_248);
  }
  local_160._0_1_ = true;
  PassRunner::run((PassRunner *)auStack_248);
  PassRunner::~PassRunner((PassRunner *)auStack_248);
  __x = (_Link_type)analysis_1._48_8_;
  addFunctions(pAVar23,(Module *)analysis_1._48_8_);
  std::
  _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)auStack_508);
  anon_unknown_0::FakeGlobalHelper::~FakeGlobalHelper((FakeGlobalHelper *)local_728);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
  ::_M_erase((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
              *)local_748,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if ((size_type *)removeListInput.field_2._8_8_ != &onlyListInput._M_string_length) {
    operator_delete((void *)removeListInput.field_2._8_8_,onlyListInput._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_528.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_548.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (local_6a8 != (undefined1  [8])&removeListInput._M_string_length) {
    operator_delete((void *)local_6a8,removeListInput._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&func_1);
  if (local_8e8 != (undefined1  [8])&ignoreImports._M_string_length) {
    operator_delete((void *)local_8e8,ignoreImports._M_string_length + 1);
  }
  if ((size_type *)ignoreImports.field_2._8_8_ != &stateChangingImports._M_string_length) {
    operator_delete((void *)ignoreImports.field_2._8_8_,stateChangingImports._M_string_length + 1);
  }
  return;
}

Assistant:

void run(Module* module) override {
    bool optimize = getPassOptions().optimizeLevel > 0;

    // Find which things can change the state.
    auto stateChangingImports = String::trim(read_possible_response_file(
      getArgumentOrDefault("asyncify-imports", "")));
    auto ignoreImports = getArgumentOrDefault("asyncify-ignore-imports", "");
    bool allImportsCanChangeState =
      stateChangingImports == "" && ignoreImports == "";
    String::Split listedImports(stateChangingImports,
                                String::Split::NewLineOr(","));
    // canIndirectChangeState is the default.  asyncify-ignore-indirect sets it
    // to false.
    auto canIndirectChangeState = !hasArgument("asyncify-ignore-indirect");
    std::string removeListInput =
      getArgumentOrDefault("asyncify-removelist", "");
    if (removeListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      removeListInput = getArgumentOrDefault("asyncify-blacklist", "");
    }
    String::Split removeList(
      String::trim(read_possible_response_file(removeListInput)),
      String::Split::NewLineOr(","));
    String::Split addList(String::trim(read_possible_response_file(
                            getArgumentOrDefault("asyncify-addlist", ""))),
                          String::Split::NewLineOr(","));
    std::string onlyListInput = getArgumentOrDefault("asyncify-onlylist", "");
    if (onlyListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      onlyListInput = getArgumentOrDefault("asyncify-whitelist", "");
    }
    String::Split onlyList(
      String::trim(read_possible_response_file(onlyListInput)),
      String::Split::NewLineOr(","));
    auto asserts = hasArgument("asyncify-asserts");
    auto verbose = hasArgument("asyncify-verbose");
    auto relocatable = hasArgument("asyncify-relocatable");
    auto secondaryMemory = hasArgument("asyncify-in-secondary-memory");
    auto propagateAddList = hasArgument("asyncify-propagate-addlist");

    // Ensure there is a memory, as we need it.

    if (secondaryMemory) {
      auto secondaryMemorySizeString =
        getArgumentOrDefault("asyncify-secondary-memory-size", "1");
      Address secondaryMemorySize = std::stoi(secondaryMemorySizeString);
      asyncifyMemory = createSecondaryMemory(module, secondaryMemorySize);
    } else {
      if (module->memories.size() <= 1) {
        MemoryUtils::ensureExists(module);
        asyncifyMemory = module->memories[0]->name;
      } else {
        auto asyncifyMemoryValue =
          getArgumentOrDefault("asyncify-memory", "memory");
        for (auto& theExport : module->exports) {
          if (theExport->kind == ExternalKind::Memory &&
              theExport->name == asyncifyMemoryValue) {
            asyncifyMemory = *theExport->getInternalName();
            break;
          }
        }
        if (!asyncifyMemory) {
          Fatal() << "Please specify which of the multiple memories to use, "
                     "with --pass-arg=asyncify-memory@memory";
        }
      }
    }
    pointerType =
      module->getMemory(asyncifyMemory)->is64() ? Type::i64 : Type::i32;

    removeList = handleBracketingOperators(removeList);
    addList = handleBracketingOperators(addList);
    onlyList = handleBracketingOperators(onlyList);

    if (!onlyList.empty() && (!removeList.empty() || !addList.empty())) {
      Fatal() << "It makes no sense to use both an asyncify only-list together "
                 "with another list.";
    }

    auto canImportChangeState = [&](Name module, Name base) {
      if (allImportsCanChangeState) {
        return true;
      }
      auto full = getFullImportName(module, base);
      for (auto& listedImport : listedImports) {
        if (String::wildcardMatch(listedImport, full)) {
          return true;
        }
      }
      return false;
    };

    // Scan the module.
    ModuleAnalyzer analyzer(*module,
                            canImportChangeState,
                            canIndirectChangeState,
                            removeList,
                            addList,
                            propagateAddList,
                            onlyList,
                            verbose);

    // Add necessary globals before we emit code to use them.
    addGlobals(module, relocatable);

    // Compute the set of functions we will instrument. All of the passes we run
    // below only need to run there.
    PassUtils::FuncSet instrumentedFuncs;
    for (auto& func : module->functions) {
      if (analyzer.needsInstrumentation(func.get())) {
        instrumentedFuncs.insert(func.get());
      }
    }

    // Instrument the flow of code, adding code instrumentation and
    // skips for when rewinding. We do this on flat IR so that it is
    // practical to add code around each call, without affecting
    // anything else.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      runner.add("flatten");
      // Dce is useful here, since AsyncifyFlow makes control flow conditional,
      // which may make unreachable code look reachable. It also lets us ignore
      // unreachable code here.
      runner.add("dce");
      if (optimize) {
        // Optimizing before AsyncifyFlow is crucial, especially coalescing,
        // because the flow changes add many branches, break up if-elses, etc.,
        // all of which extend the live ranges of locals. In other words, it is
        // not possible to coalesce well afterwards.
        runner.add("remove-unused-names");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("coalesce-locals");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("merge-blocks");
      }
      runner.add(
        std::make_unique<AsyncifyFlow>(&analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    if (asserts) {
      // Add asserts in non-instrumented code. Note we do not use an
      // instrumented pass runner here as we do want to run on all functions.
      PassRunner runner(module);
      runner.add(std::make_unique<AsyncifyAssertInNonInstrumented>(
        &analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Next, add local saving/restoring logic. We optimize before doing this,
    // to undo the extra code generated by flattening, and to arrive at the
    // minimal amount of locals (which is important as we must save and
    // restore those locals). We also and optimize after as well to simplify
    // the code as much as possible.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.add(std::make_unique<AsyncifyLocals>(
        &analyzer, pointerType, asyncifyMemory));
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Finally, add function support (that should not have been seen by
    // the previous passes).
    addFunctions(module);
  }